

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicodeUtf8.c
# Opt level: O2

uint8_t encodeUtf8(uint8_t *buf,int value)

{
  byte bVar1;
  
  bVar1 = (byte)value;
  if (value < 0x80) {
    *buf = bVar1 & 0x7f;
    return '\x01';
  }
  if ((uint)value < 0x800) {
    *buf = (byte)((uint)value >> 6) | 0xc0;
    buf[1] = bVar1 & 0x3f | 0x80;
    return '\x02';
  }
  if ((uint)value < 0x10000) {
    *buf = (byte)((uint)value >> 0xc) | 0xe0;
    buf[1] = (byte)((uint)value >> 6) & 0x3f | 0x80;
    buf[2] = bVar1 & 0x3f | 0x80;
    return '\x03';
  }
  if ((uint)value < 0x110000) {
    *buf = (byte)((uint)value >> 0x12) | 0xf0;
    buf[1] = (byte)((uint)value >> 0xc) & 0x3f | 0x80;
    buf[2] = (byte)((uint)value >> 6) & 0x3f | 0x80;
    buf[3] = bVar1 & 0x3f | 0x80;
    return '\x04';
  }
  fprintf(_stderr,"NOT_REACHED: %s:%d In function %s()\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/koshox[P]crab/include/unicodeUtf8.c"
          ,0x45,"encodeUtf8");
  do {
  } while( true );
}

Assistant:

uint8_t encodeUtf8(uint8_t *buf, int value) {
    ASSERT(value > 0, "Can`t encode negative value!");

    // 按照大端字节序写入缓冲区
    if (value <= 0x7f) {
        // 单个ascii字符需要1字节 0xxx xxxx
        *buf = value & 0x7f;
        return 1;
    } else if (value <= 0x7ff) {
        //此范围内数值编码为utf8需要2字节 110xxxxx 10xxxxxx
        //先写入高字节
        *buf++ = 0xc0 | ((value & 0x7c0) >> 6);
        // 再写入低字节
        *buf = 0x80 | (value & 0x3f);
        return 2;
    } else if (value <= 0xffff) {
        //此范围内数值编码为utf8需要3字节 1110xxxx 10xxxxxx 10xxxxxx
        // 先写入高字节
        *buf++ = 0xe0 | ((value & 0xf000) >> 12);
        //再写入中间字节
        *buf++ = 0x80 | ((value & 0xfc0) >> 6);
        //最后写入低字节
        *buf = 0x80 | (value & 0x3f);
        return 3;
    } else if (value <= 0x10ffff) {
        //此范围内数值编码为utf8需要4字节 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
        *buf++ = 0xf0 | ((value & 0x1c0000) >> 18);
        *buf++ = 0x80 | ((value & 0x3f000) >> 12);
        *buf++ = 0x80 | ((value & 0xfc0) >> 6);
        *buf = 0x80 | (value & 0x3f);
        return 4;
    }

    NOT_REACHED();
    return 0;
}